

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmSourceFileSetName(void *arg,char *name,char *dir,int numSourceExtensions,
                        char **sourceExtensions,int numHeaderExtensions,char **headerExtensions)

{
  string *this;
  void *pvVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  pointer pbVar5;
  ulong uVar6;
  ulong uVar7;
  allocator local_251;
  void *local_250;
  string hname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerExts;
  string local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceExts;
  string pathname;
  ostringstream e;
  
  if (*arg == 0) {
    sourceExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    headerExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sourceExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sourceExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    headerExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    headerExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar7 = 0;
    uVar6 = (ulong)(uint)numSourceExtensions;
    if (numSourceExtensions < 1) {
      uVar6 = uVar7;
    }
    local_250 = arg;
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      std::__cxx11::string::string((string *)&e,sourceExtensions[uVar7],(allocator *)&pathname);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sourceExts,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
      std::__cxx11::string::~string((string *)&e);
    }
    uVar7 = 0;
    uVar6 = (ulong)(uint)numHeaderExtensions;
    if (numHeaderExtensions < 1) {
      uVar6 = uVar7;
    }
    for (; pvVar1 = local_250, uVar6 != uVar7; uVar7 = uVar7 + 1) {
      std::__cxx11::string::string((string *)&e,headerExtensions[uVar7],(allocator *)&pathname);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&headerExts,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
      std::__cxx11::string::~string((string *)&e);
    }
    this = (string *)((long)local_250 + 8);
    std::__cxx11::string::assign((char *)this);
    std::__cxx11::string::string((string *)&e,name,(allocator *)&hname);
    cmsys::SystemTools::CollapseFullPath(&pathname,(string *)&e,dir);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::string((string *)&hname,(string *)&pathname);
    bVar2 = cmsys::SystemTools::FileExists(hname._M_dataplus._M_p);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_208,name,&local_251);
      cmsys::SystemTools::GetFilenamePath((string *)&e,&local_208);
      std::__cxx11::string::operator=(this,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_208);
      if (*(long *)((long)pvVar1 + 0x10) != 0) {
        std::__cxx11::string::append((char *)this);
      }
      std::__cxx11::string::string((string *)&local_208,name,&local_251);
      cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&e,&local_208);
      std::__cxx11::string::append(this);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_208);
      lVar3 = std::__cxx11::string::rfind((char)&hname,0x2e);
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)&e,(ulong)&hname);
        std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x28),(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        bVar2 = cmsys::SystemTools::FileIsFullPath(name);
        if (bVar2) {
          lVar3 = std::__cxx11::string::rfind((char)&hname,0x2f);
          if (lVar3 != -1) {
            std::__cxx11::string::substr((ulong)&e,(ulong)&hname);
            std::__cxx11::string::operator=(this,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
          }
        }
      }
      std::__cxx11::string::_M_assign((string *)((long)pvVar1 + 0x48));
    }
    else {
      for (pbVar5 = sourceExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != sourceExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        std::__cxx11::string::_M_assign((string *)&hname);
        std::__cxx11::string::append((char *)&hname);
        std::__cxx11::string::append((string *)&hname);
        bVar2 = cmsys::SystemTools::FileExists(hname._M_dataplus._M_p);
        pvVar1 = local_250;
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)((long)local_250 + 0x28));
          std::__cxx11::string::_M_assign((string *)((long)pvVar1 + 0x48));
          goto LAB_003426d7;
        }
      }
      for (pbVar5 = headerExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != headerExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        std::__cxx11::string::_M_assign((string *)&hname);
        std::__cxx11::string::append((char *)&hname);
        std::__cxx11::string::append((string *)&hname);
        bVar2 = cmsys::SystemTools::FileExists(hname._M_dataplus._M_p);
        pvVar1 = local_250;
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)((long)local_250 + 0x28));
          std::__cxx11::string::_M_assign((string *)((long)pvVar1 + 0x48));
          goto LAB_003426d7;
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"Cannot find source file \"");
      poVar4 = std::operator<<(poVar4,(string *)&pathname);
      std::operator<<(poVar4,"\"");
      std::operator<<((ostream *)&e,"\n\nTried extensions");
      for (pbVar5 = sourceExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != sourceExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        poVar4 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar4,(string *)pbVar5);
      }
      for (pbVar5 = headerExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != headerExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        poVar4 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar4,(string *)pbVar5);
      }
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_208._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
LAB_003426d7:
    std::__cxx11::string::~string((string *)&hname);
    std::__cxx11::string::~string((string *)&pathname);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&headerExts);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sourceExts);
  }
  return;
}

Assistant:

void CCONV cmSourceFileSetName(void* arg, const char* name, const char* dir,
                               int numSourceExtensions,
                               const char** sourceExtensions,
                               int numHeaderExtensions,
                               const char** headerExtensions)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (sf->RealSourceFile) {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
  }
  std::vector<std::string> sourceExts;
  std::vector<std::string> headerExts;
  int i;
  for (i = 0; i < numSourceExtensions; ++i) {
    sourceExts.push_back(sourceExtensions[i]);
  }
  for (i = 0; i < numHeaderExtensions; ++i) {
    headerExts.push_back(headerExtensions[i]);
  }

  // Save the original name given.
  sf->SourceName = name;

  // Convert the name to a full path in case the given name is a
  // relative path.
  std::string pathname = cmSystemTools::CollapseFullPath(name, dir);

  // First try and see whether the listed file can be found
  // as is without extensions added on.
  std::string hname = pathname;
  if (cmSystemTools::FileExists(hname.c_str())) {
    sf->SourceName = cmSystemTools::GetFilenamePath(name);
    if (!sf->SourceName.empty()) {
      sf->SourceName += "/";
    }
    sf->SourceName += cmSystemTools::GetFilenameWithoutLastExtension(name);
    std::string::size_type pos = hname.rfind('.');
    if (pos != std::string::npos) {
      sf->SourceExtension = hname.substr(pos + 1, hname.size() - pos);
      if (cmSystemTools::FileIsFullPath(name)) {
        std::string::size_type pos2 = hname.rfind('/');
        if (pos2 != std::string::npos) {
          sf->SourceName = hname.substr(pos2 + 1, pos - pos2 - 1);
        }
      }
    }

    sf->FullPath = hname;
    return;
  }

  // Next, try the various source extensions
  for (std::vector<std::string>::const_iterator ext = sourceExts.begin();
       ext != sourceExts.end(); ++ext) {
    hname = pathname;
    hname += ".";
    hname += *ext;
    if (cmSystemTools::FileExists(hname.c_str())) {
      sf->SourceExtension = *ext;
      sf->FullPath = hname;
      return;
    }
  }

  // Finally, try the various header extensions
  for (std::vector<std::string>::const_iterator ext = headerExts.begin();
       ext != headerExts.end(); ++ext) {
    hname = pathname;
    hname += ".";
    hname += *ext;
    if (cmSystemTools::FileExists(hname.c_str())) {
      sf->SourceExtension = *ext;
      sf->FullPath = hname;
      return;
    }
  }

  std::ostringstream e;
  e << "Cannot find source file \"" << pathname << "\"";
  e << "\n\nTried extensions";
  for (std::vector<std::string>::const_iterator ext = sourceExts.begin();
       ext != sourceExts.end(); ++ext) {
    e << " ." << *ext;
  }
  for (std::vector<std::string>::const_iterator ext = headerExts.begin();
       ext != headerExts.end(); ++ext) {
    e << " ." << *ext;
  }
  cmSystemTools::Error(e.str().c_str());
}